

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O0

void explorer::DumpToFile<uttt::IBoard,uttt::IBoardWriter>
               (string *filename,vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *data)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_RSI;
  string *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ofstream file;
  rep millis;
  time_point t2;
  vector<char,_std::allocator<char>_> bytes;
  time_point t1;
  int i;
  char count_buf [8];
  longlong count;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffc78;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffc80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffc88;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *in_stack_fffffffffffffce0;
  IBoardWriter *in_stack_fffffffffffffce8;
  duration<long,_std::ratio<1L,_1000L>_> local_298;
  undefined8 local_290;
  char local_288 [512];
  undefined8 local_88;
  rep local_70;
  duration<long,_std::ratio<1L,_1000L>_> local_68;
  rep local_60;
  undefined8 local_58;
  vector<char,_std::allocator<char>_> local_48;
  undefined8 local_30;
  int local_24;
  undefined1 local_20 [8];
  size_type local_18;
  vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size(in_RSI);
  for (local_24 = 7; -1 < local_24; local_24 = local_24 + -1) {
    local_20[local_24] = (char)local_18;
    local_18 = (long)local_18 >> 8;
  }
  local_18 = std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::size(local_10);
  poVar1 = std::operator<<((ostream *)&std::cout,"Serializing ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  std::operator<<(poVar1," nodes...\n");
  local_30 = std::chrono::_V2::system_clock::now();
  uttt::IBoardWriter::operator()(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  local_58 = std::chrono::_V2::system_clock::now();
  local_70 = (rep)std::chrono::operator-(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  local_68.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_fffffffffffffc78);
  local_60 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Serialization done: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," nodes in ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60 / 1000);
  poVar1 = std::operator<<(poVar1,"s ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60 % 1000);
  poVar1 = std::operator<<(poVar1,"ms, ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,((double)(long)local_18 * 1000.0) / (double)local_60);
  poVar1 = std::operator<<(poVar1," nps, ");
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_48);
  auVar5._8_4_ = (int)(sVar2 >> 0x20);
  auVar5._0_8_ = sVar2;
  auVar5._12_4_ = 0x45300000;
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(((auVar5._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
                              0.0009765625 * 1000.0 * 0.0009765625) / (double)local_60);
  std::operator<<(poVar1," MB/s\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Writing ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1," nodes to ");
  poVar1 = std::operator<<(poVar1,local_8);
  std::operator<<(poVar1,'\n');
  local_88 = std::chrono::_V2::system_clock::now();
  local_30 = local_88;
  std::ofstream::ofstream(local_288,local_8,_S_bin);
  std::ostream::write(local_288,(long)local_20);
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
  std::vector<char,_std::allocator<char>_>::size(&local_48);
  std::ostream::write(local_288,(long)pvVar3);
  local_290 = std::chrono::_V2::system_clock::now();
  local_58 = local_290;
  std::chrono::operator-(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  local_298.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (in_stack_fffffffffffffc78);
  local_60 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_298);
  poVar1 = std::operator<<((ostream *)&std::cout,"Writing done: ");
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," bytes in ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60 / 1000);
  poVar1 = std::operator<<(poVar1,"s ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60 % 1000);
  poVar4 = std::operator<<(poVar1,"ms, ");
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&local_48);
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(((auVar6._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) *
                              0.0009765625 * 1000.0 * 0.0009765625) / (double)local_60);
  std::operator<<(poVar4," MB/s\n");
  std::ofstream::~ofstream(local_288);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)poVar1);
  return;
}

Assistant:

static void
DumpToFile(const std::string &filename, const std::vector<IGame> &data)
{
    long long count = data.size();

    char count_buf[8];
    for (int i = 7; i >= 0; --i)
    {
        count_buf[i] = count & 0xff;
        count >>= 8;
    }

    count = data.size();

    std::cout << "Serializing " << count << " nodes...\n";
    auto t1 = std::chrono::high_resolution_clock::now();
    auto bytes = Writer()(data);
    auto t2 = std::chrono::high_resolution_clock::now();
    auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Serialization done: " << count << " nodes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(count) * 1000 / millis << " nps, " << double(bytes.size()) / 1024 * 1000 / 1024 / millis << " MB/s\n";

    std::cout << "Writing " << count << " nodes to " << filename << '\n';
    t1 = std::chrono::high_resolution_clock::now();
    std::ofstream file(filename, std::ios::binary);
    file.write(count_buf, 8);
    file.write(&bytes[0], bytes.size());
    t2 = std::chrono::high_resolution_clock::now();
    millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
    std::cout << "Writing done: " << bytes.size() << " bytes in " << millis / 1000 << "s " << millis % 1000 << "ms, " << double(bytes.size()) / 1024 * 1000 / 1024 / millis << " MB/s\n";
}